

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O2

mi_page_t *
mi_segment_huge_page_alloc
          (size_t size,size_t page_alignment,mi_arena_id_t req_arena_id,mi_segments_tld_t *tld)

{
  mi_segment_t *segment;
  uint8_t *sz;
  uintptr_t uVar1;
  mi_page_t *pmVar2;
  size_t psize;
  mi_page_t *page;
  size_t local_38;
  mi_page_t *local_30;
  
  local_30 = (mi_page_t *)0x0;
  segment = mi_segment_alloc(size,page_alignment,req_arena_id,tld,&local_30);
  pmVar2 = local_30;
  if (local_30 == (mi_page_t *)0x0 || segment == (mi_segment_t *)0x0) {
    pmVar2 = (mi_page_t *)0x0;
  }
  else {
    sz = _mi_segment_page_start(segment,local_30,&local_38);
    pmVar2->block_size = local_38;
    if ((page_alignment != 0) && (segment->allow_decommit == true)) {
      uVar1 = _mi_align_up((uintptr_t)sz,page_alignment);
      _mi_os_reset(sz + 8,uVar1 - (long)(sz + 8));
    }
  }
  return pmVar2;
}

Assistant:

static mi_page_t* mi_segment_huge_page_alloc(size_t size, size_t page_alignment, mi_arena_id_t req_arena_id, mi_segments_tld_t* tld)
{
  mi_page_t* page = NULL;
  mi_segment_t* segment = mi_segment_alloc(size,page_alignment,req_arena_id,tld,&page);
  if (segment == NULL || page==NULL) return NULL;
  mi_assert_internal(segment->used==1);
  mi_assert_internal(mi_page_block_size(page) >= size);
  #if MI_HUGE_PAGE_ABANDON
  segment->thread_id = 0; // huge segments are immediately abandoned
  #endif

  // for huge pages we initialize the block_size as we may
  // overallocate to accommodate large alignments.
  size_t psize;
  uint8_t* start = _mi_segment_page_start(segment, page, &psize);
  page->block_size = psize;
  mi_assert_internal(page->is_huge);

  // decommit the part of the prefix of a page that will not be used; this can be quite large (close to MI_SEGMENT_SIZE)
  if (page_alignment > 0 && segment->allow_decommit) {
    uint8_t* aligned_p = (uint8_t*)_mi_align_up((uintptr_t)start, page_alignment);
    mi_assert_internal(_mi_is_aligned(aligned_p, page_alignment));
    mi_assert_internal(psize - (aligned_p - start) >= size);
    uint8_t* decommit_start = start + sizeof(mi_block_t);              // for the free list
    ptrdiff_t decommit_size = aligned_p - decommit_start;
    _mi_os_reset(decommit_start, decommit_size);   // note: cannot use segment_decommit on huge segments
  }

  return page;
}